

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
::expand(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *this)

{
  Entry *__ptr;
  bool bVar1;
  int iVar2;
  int iVar3;
  Entry *pEVar4;
  int *in_RDI;
  int remaining;
  Entry *current;
  void *mem;
  Entry *oldEntries;
  size_t oldCapacity;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Entry *local_28;
  
  if (*in_RDI == 0) {
    iVar2 = 0x20;
  }
  else {
    iVar2 = *in_RDI << 1;
  }
  *in_RDI = iVar2;
  __ptr = *(Entry **)(in_RDI + 2);
  Lib::alloc(CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  pEVar4 = array_new<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
                     ((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (size_t)in_RDI);
  *(Entry **)(in_RDI + 2) = pEVar4;
  *(long *)(in_RDI + 4) = *(long *)(in_RDI + 2) + (long)*in_RDI * 0x38;
  in_RDI[6] = (int)((double)*in_RDI * 0.8);
  iVar3 = in_RDI[1];
  in_RDI[1] = 0;
  local_28 = __ptr;
  for (; iVar3 != 0; iVar3 = iVar3 + -1) {
    while (bVar1 = Entry::occupied(local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffffb8 = Entry::key(local_28);
    Entry::value(local_28);
    insert((Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
            *)oldCapacity,&oldEntries->code,(Bucket *)mem,current._4_4_);
    local_28 = local_28 + 1;
  }
  if (__ptr != (Entry *)0x0) {
    array_delete<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
              ((Entry *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(size_t)in_stack_ffffffffffffffb8)
    ;
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }